

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_crypt_fuzzer.cc
# Opt level: O2

void __thiscall FuzzHelper::testWrite(FuzzHelper *this)

{
  FuzzHelper *this_00;
  shared_ptr<QPDFWriter> w;
  undefined1 local_58 [16];
  shared_ptr<QPDF> q;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  getQpdf((FuzzHelper *)local_58);
  std::__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>);
  getWriter((FuzzHelper *)local_58,(shared_ptr<QPDF> *)this);
  std::__shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  QPDFWriter::setStaticID(w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
  QPDFWriter::setLinearization
            (w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
  QPDFWriter::setR6EncryptionParameters
            (w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,"u","o",true,true,
             true,true,true,true,qpdf_r3p_full,true);
  this_00 = (FuzzHelper *)&stack0xffffffffffffffc8;
  std::__shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8,
             &w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>);
  doWrite(this_00,(shared_ptr<QPDFWriter> *)&stack0xffffffffffffffc8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&w.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&q.super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
FuzzHelper::testWrite()
{
    // Write in various ways to exercise QPDFWriter

    std::shared_ptr<QPDF> q;
    std::shared_ptr<QPDFWriter> w;

    q = getQpdf();
    w = getWriter(q);
    w->setStaticID(true);
    w->setLinearization(true);
    w->setR6EncryptionParameters("u", "o", true, true, true, true, true, true, qpdf_r3p_full, true);
    doWrite(w);
}